

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag_help_or_version_test.cpp
# Opt level: O0

void __thiscall flag_help::test_method(flag_help *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names;
  initializer_list<char> short_names;
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  argument_order order;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e0;
  basic_cstring<const_char> local_590;
  basic_cstring<const_char> local_580;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_570;
  undefined1 local_54b;
  bool local_54a;
  value_expr<bool> local_549;
  assertion_result local_548;
  basic_cstring<const_char> local_530;
  basic_cstring<const_char> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  undefined1 local_500 [8];
  type opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  iterator local_4b0;
  size_type local_4a8;
  undefined1 local_4a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  allocator local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_438;
  allocator local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  allocator local_3c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_372;
  allocator local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  iterator local_348;
  size_type local_340;
  char local_331 [9];
  size_type local_328;
  allocator local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  allocator local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_2c0;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>,_std::tuple<>,_std::tuple<>_>
  local_278;
  undefined1 local_188 [8];
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
  cmd;
  flag_help *this_local;
  
  cmd._368_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"flag_help",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"",&local_319);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_2c0,&local_2e0,&local_318);
  local_331[0] = 'h';
  local_331._1_8_ = local_331;
  local_328 = 1;
  local_372 = 1;
  local_370 = &local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"help",&local_371);
  local_372 = 0;
  local_348 = &local_368;
  local_340 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"",&local_399);
  short_names._M_len = local_328;
  short_names._M_array = (iterator)local_331._1_8_;
  long_names._M_len = local_340;
  long_names._M_array = local_348;
  sVar3 = local_340;
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::flag<_H_,_bool,_nullptr>(&local_278,&local_2c0,short_names,long_names,&local_398,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"sub",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"subcommand",&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_480,"",
             (allocator *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_438,&local_458,&local_480);
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)72,void>>,std::tuple<>,std::tuple<>>
  ::
  subcommand<(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
              *)local_188,&local_278,&local_3c0,&local_3e8,&local_438);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_438);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_278);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  local_5e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348;
  do {
    local_5e0 = local_5e0 + -1;
    std::__cxx11::string::~string((string *)local_5e0);
  } while (local_5e0 != &local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_2c0);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  opts.super_option_pair<char,__S_,_nonsugar::option_map<char>_>.value.
  super___shared_ptr<nonsugar::option_map<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
       = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4d0,"-h",
             (allocator *)
             ((long)&opts.super_option_pair<char,__S_,_nonsugar::option_map<char>_>.value.
                     super___shared_ptr<nonsugar::option_map<char>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  opts.super_option_pair<char,__S_,_nonsugar::option_map<char>_>.value.
  super___shared_ptr<nonsugar::option_map<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
       = 0;
  local_4b0 = &local_4d0;
  local_4a8 = 1;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&opts.super_option_pair<char,__S_,_nonsugar::option_map<char>_>.value.
                       super___shared_ptr<nonsugar::option_map<char>,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_4a8;
  __l._M_array = local_4b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4a0,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&opts.super_option_pair<char,__S_,_nonsugar::option_map<char>_>.value.
                        super___shared_ptr<nonsugar::option_map<char>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 5));
  local_610 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b0;
  do {
    local_610 = local_610 + -1;
    std::__cxx11::string::~string((string *)local_610);
    order = (argument_order)sVar3;
  } while (local_610 != &local_4d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts.super_option_pair<char,__S_,_nonsugar::option_map<char>_>.value.
                     super___shared_ptr<nonsugar::option_map<char>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_508 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4a0);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4a0);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)72,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>>>,std::tuple<>>>
            ((type *)local_500,(nonsugar *)local_508,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
              *)0x0,order);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_520,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_help_or_version_test.cpp"
               ,0x66);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_530);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_520,0x1d,&local_530);
    local_54b = nonsugar::
                option_map<char,nonsugar::detail::option_pair<char,(char)72,void>,nonsugar::detail::option_pair<char,(char)83,nonsugar::option_map<char>>>
                ::has<(char)72>((option_map<char,nonsugar::detail::option_pair<char,(char)72,void>,nonsugar::detail::option_pair<char,(char)83,nonsugar::option_map<char>>>
                                 *)local_500);
    boost::test_tools::assertion::seed::operator->*((seed *)&local_549,&local_54a);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_548,&local_549,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_580,"opts.has<\'H\'>()",0xf);
    boost::unit_test::operator<<(&local_570,prev,&local_580);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_help_or_version_test.cpp"
               ,0x66);
    boost::test_tools::tt_detail::report_assertion(&local_548,&local_570,&local_590,0x1d,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_570);
    boost::test_tools::assertion_result::~assertion_result(&local_548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'H',_void>,_nonsugar::detail::option_pair<char,_'S',_nonsugar::option_map<char>_>_>
  ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__H_,_void>,_nonsugar::detail::option_pair<char,__S_,_nonsugar::option_map<char>_>_>
                 *)local_500);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4a0);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'S',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
                    *)local_188);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(flag_help)
{
    auto const cmd = command<char>("flag_help", "")
        .flag<'H'>({'h'}, {"help"}, "", true)
        .subcommand<'S'>("sub", "subcommand", command<char>("", ""))
        ;
    std::vector<std::string> const args = { "-h" };
    auto const opts = parse(args.begin(), args.end(), cmd);
    BOOST_TEST(opts.has<'H'>());
}